

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itoa.h
# Opt level: O0

char * rapidjson::internal::u32toa(uint32_t value,char *buffer)

{
  uint uVar1;
  char *pcVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  uint32_t d4_1;
  uint32_t d3_1;
  uint32_t d2_2;
  uint32_t d1_2;
  uint32_t c_1;
  uint32_t b_1;
  uint i;
  uint32_t a;
  uint32_t d4;
  uint32_t d3;
  uint32_t d2_1;
  uint32_t d1_1;
  uint32_t c;
  uint32_t b;
  uint32_t d2;
  uint32_t d1;
  char *cDigitsLut;
  char *buffer_local;
  uint32_t value_local;
  
  if (buffer == (char *)0x0) {
    __assert_fail("buffer != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/j05070415[P]RJson/rapidjson/include/rapidjson/internal/itoa.h"
                  ,0x28,"char *rapidjson::internal::u32toa(uint32_t, char *)");
  }
  pcVar2 = GetDigitsLut();
  cDigitsLut = buffer;
  if (value < 10000) {
    uVar1 = (value / 100) * 2;
    uVar3 = (value % 100) * 2;
    if (999 < value) {
      cDigitsLut = buffer + 1;
      *buffer = pcVar2[uVar1];
    }
    if (99 < value) {
      *cDigitsLut = pcVar2[uVar1 + 1];
      cDigitsLut = cDigitsLut + 1;
    }
    if (9 < value) {
      *cDigitsLut = pcVar2[uVar3];
      cDigitsLut = cDigitsLut + 1;
    }
    *cDigitsLut = pcVar2[uVar3 + 1];
    cDigitsLut = cDigitsLut + 1;
  }
  else if (value < 100000000) {
    uVar1 = ((value / 10000) / 100) * 2;
    uVar4 = ((value / 10000) % 100) * 2;
    uVar3 = ((value % 10000) / 100) * 2;
    uVar5 = ((value % 10000) % 100) * 2;
    if (9999999 < value) {
      cDigitsLut = buffer + 1;
      *buffer = pcVar2[uVar1];
    }
    if (999999 < value) {
      *cDigitsLut = pcVar2[uVar1 + 1];
      cDigitsLut = cDigitsLut + 1;
    }
    if (99999 < value) {
      *cDigitsLut = pcVar2[uVar4];
      cDigitsLut = cDigitsLut + 1;
    }
    *cDigitsLut = pcVar2[uVar4 + 1];
    cDigitsLut[1] = pcVar2[uVar3];
    cDigitsLut[2] = pcVar2[uVar3 + 1];
    pcVar6 = cDigitsLut + 4;
    cDigitsLut[3] = pcVar2[uVar5];
    cDigitsLut = cDigitsLut + 5;
    *pcVar6 = pcVar2[uVar5 + 1];
  }
  else {
    uVar1 = value / 100000000;
    if (uVar1 < 10) {
      cDigitsLut = buffer + 1;
      *buffer = (char)uVar1 + '0';
    }
    else {
      *buffer = pcVar2[uVar1 * 2];
      cDigitsLut = buffer + 2;
      buffer[1] = pcVar2[uVar1 * 2 + 1];
    }
    uVar1 = (value % 100000000) / 10000;
    uVar4 = (value % 100000000) % 10000;
    uVar3 = (uVar1 / 100) * 2;
    uVar5 = (uVar1 % 100) * 2;
    uVar1 = (uVar4 / 100) * 2;
    uVar4 = (uVar4 % 100) * 2;
    *cDigitsLut = pcVar2[uVar3];
    cDigitsLut[1] = pcVar2[uVar3 + 1];
    cDigitsLut[2] = pcVar2[uVar5];
    cDigitsLut[3] = pcVar2[uVar5 + 1];
    cDigitsLut[4] = pcVar2[uVar1];
    cDigitsLut[5] = pcVar2[uVar1 + 1];
    pcVar6 = cDigitsLut + 7;
    cDigitsLut[6] = pcVar2[uVar4];
    cDigitsLut = cDigitsLut + 8;
    *pcVar6 = pcVar2[uVar4 + 1];
  }
  return cDigitsLut;
}

Assistant:

inline char* u32toa(uint32_t value, char* buffer) {
    RAPIDJSON_ASSERT(buffer != 0);

    const char* cDigitsLut = GetDigitsLut();

    if (value < 10000) {
        const uint32_t d1 = (value / 100) << 1;
        const uint32_t d2 = (value % 100) << 1;

        if (value >= 1000)
            *buffer++ = cDigitsLut[d1];
        if (value >= 100)
            *buffer++ = cDigitsLut[d1 + 1];
        if (value >= 10)
            *buffer++ = cDigitsLut[d2];
        *buffer++ = cDigitsLut[d2 + 1];
    }
    else if (value < 100000000) {
        // value = bbbbcccc
        const uint32_t b = value / 10000;
        const uint32_t c = value % 10000;

        const uint32_t d1 = (b / 100) << 1;
        const uint32_t d2 = (b % 100) << 1;

        const uint32_t d3 = (c / 100) << 1;
        const uint32_t d4 = (c % 100) << 1;

        if (value >= 10000000)
            *buffer++ = cDigitsLut[d1];
        if (value >= 1000000)
            *buffer++ = cDigitsLut[d1 + 1];
        if (value >= 100000)
            *buffer++ = cDigitsLut[d2];
        *buffer++ = cDigitsLut[d2 + 1];

        *buffer++ = cDigitsLut[d3];
        *buffer++ = cDigitsLut[d3 + 1];
        *buffer++ = cDigitsLut[d4];
        *buffer++ = cDigitsLut[d4 + 1];
    }
    else {
        // value = aabbbbcccc in decimal

        const uint32_t a = value / 100000000; // 1 to 42
        value %= 100000000;

        if (a >= 10) {
            const unsigned i = a << 1;
            *buffer++ = cDigitsLut[i];
            *buffer++ = cDigitsLut[i + 1];
        }
        else
            *buffer++ = static_cast<char>('0' + static_cast<char>(a));

        const uint32_t b = value / 10000; // 0 to 9999
        const uint32_t c = value % 10000; // 0 to 9999

        const uint32_t d1 = (b / 100) << 1;
        const uint32_t d2 = (b % 100) << 1;

        const uint32_t d3 = (c / 100) << 1;
        const uint32_t d4 = (c % 100) << 1;

        *buffer++ = cDigitsLut[d1];
        *buffer++ = cDigitsLut[d1 + 1];
        *buffer++ = cDigitsLut[d2];
        *buffer++ = cDigitsLut[d2 + 1];
        *buffer++ = cDigitsLut[d3];
        *buffer++ = cDigitsLut[d3 + 1];
        *buffer++ = cDigitsLut[d4];
        *buffer++ = cDigitsLut[d4 + 1];
    }
    return buffer;
}